

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::PrefixedExpr(SQParser *this)

{
  SQInteger SVar1;
  SQInteger SVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  CallExpr *this_00;
  Expr *pEVar6;
  CallExpr *pCVar7;
  char *pcVar8;
  SQParser *pos;
  long lVar9;
  NestingChecker nc;
  
  pos = this;
  NestingChecker::NestingChecker(&nc,this);
  this_00 = (CallExpr *)Factor(this,(SQInteger *)pos);
  bVar5 = false;
LAB_00154dff:
  do {
    while( true ) {
      NestingChecker::inc(&nc);
      lVar9 = this->_token;
      if (lVar9 != 0x28) break;
LAB_00154e4c:
      if ((lVar9 == 0x28) && (((this->_lex)._prevflags & 1) != 0)) {
        reportDiagnostic(this,0x37);
        lVar9 = this->_token;
      }
      iVar3 = (this_00->super_Expr).super_Node._coordinates.lineStart;
      iVar4 = (this_00->super_Expr).super_Node._coordinates.columnStart;
      this_00 = newNode<SQCompilation::CallExpr,Arena*,SQCompilation::Expr*,long>
                          (this,this->_astArena,&this_00->super_Expr,
                           (ulong)(byte)(bVar5 | lVar9 == 0x149));
      if (this->_token == 0x28) {
        checkSuspiciousBracket(this);
      }
      Lex(this);
      bVar5 = (bool)(bVar5 | lVar9 == 0x149);
      while (this->_token != 0x29) {
        pEVar6 = Expression(this,SQE_FUNCTION_ARG);
        CallExpr::addArgument(this_00,pEVar6);
        if (this->_token == 0x2c) {
          Lex(this);
        }
      }
      (this_00->super_Expr).super_Node._coordinates.lineStart = iVar3;
      (this_00->super_Expr).super_Node._coordinates.columnStart = iVar4;
      (this_00->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
      (this_00->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
      Lex(this);
    }
    if (lVar9 == 0x2e) {
LAB_00154fb1:
      if (bVar5 != false) {
LAB_00154fb7:
        bVar5 = true;
      }
      Lex(this);
      if (((this->_lex)._prevflags & 3) != 0) {
        pcVar8 = ".";
        if (lVar9 != 0x2e) {
          if (lVar9 == 0x156) {
            pcVar8 = "?.$";
          }
          else if (lVar9 == 0x155) {
            pcVar8 = ".$";
          }
          else if (lVar9 == 0x146) {
            pcVar8 = "?.";
          }
          else {
            pcVar8 = "<unknown>";
          }
        }
        reportDiagnostic(this,0x35,pcVar8);
      }
      SVar1 = (this->_lex)._currentline;
      SVar2 = (this->_lex)._currentcolumn;
      pEVar6 = Expect(this,0x102);
      pCVar7 = (CallExpr *)
               newNode<SQCompilation::GetFieldExpr,SQCompilation::Expr*,char_const*,bool,bool>
                         (this,&this_00->super_Expr,
                          (char *)pEVar6[1].super_Node.super_ArenaObj._vptr_ArenaObj,bVar5,
                          lVar9 - 0x155U < 2);
      iVar3 = (this_00->super_Expr).super_Node._coordinates.columnStart;
      (pCVar7->super_Expr).super_Node._coordinates.lineStart =
           (this_00->super_Expr).super_Node._coordinates.lineStart;
      (pCVar7->super_Expr).super_Node._coordinates.columnStart = iVar3;
      (pCVar7->super_Expr).super_Node._coordinates.lineEnd = (int)SVar1;
      (pCVar7->super_Expr).super_Node._coordinates.columnEnd = (int)SVar2;
      this_00 = pCVar7;
      goto LAB_00154dff;
    }
    if (lVar9 != 0x5b) {
      if (lVar9 != 0x146) {
        if (lVar9 == 0x147) goto LAB_00154f14;
        if (lVar9 == 0x149) goto LAB_00154e4c;
        if (lVar9 == 0x155) goto LAB_00154fb1;
        if (lVar9 != 0x156) {
          pCVar7 = this_00;
          if ((lVar9 - 0x12fU < 2) && (bVar5 = IsEndOfStatement(this), !bVar5)) {
            pCVar7 = (CallExpr *)
                     newNode<SQCompilation::IncExpr,SQCompilation::Expr*,long,SQCompilation::IncForm>
                               (this,&this_00->super_Expr,(ulong)(this->_token != 0x130) * 2 + -1,
                                IF_POSTFIX);
            iVar3 = (this_00->super_Expr).super_Node._coordinates.columnStart;
            (pCVar7->super_Expr).super_Node._coordinates.lineStart =
                 (this_00->super_Expr).super_Node._coordinates.lineStart;
            (pCVar7->super_Expr).super_Node._coordinates.columnStart = iVar3;
            (pCVar7->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
            (pCVar7->super_Expr).super_Node._coordinates.columnEnd =
                 (int)(this->_lex)._currentcolumn;
            Lex(this);
          }
          (nc._p)->_depth = (nc._p)->_depth - nc._depth;
          return &pCVar7->super_Expr;
        }
      }
      goto LAB_00154fb7;
    }
    if (bVar5 != false) {
LAB_00154f14:
      bVar5 = true;
    }
    if ((this->_lex)._prevtoken == 10) {
      reportDiagnostic(this,0x1f);
      lVar9 = this->_token;
    }
    if (lVar9 == 0x5b) {
      checkSuspiciousBracket(this);
    }
    Lex(this);
    pEVar6 = Expression(this,SQE_RVALUE);
    pCVar7 = (CallExpr *)
             newNode<SQCompilation::GetSlotExpr,SQCompilation::Expr*,SQCompilation::Expr*,bool>
                       (this,&this_00->super_Expr,pEVar6,bVar5);
    iVar3 = (this_00->super_Expr).super_Node._coordinates.columnStart;
    (pCVar7->super_Expr).super_Node._coordinates.lineStart =
         (this_00->super_Expr).super_Node._coordinates.lineStart;
    (pCVar7->super_Expr).super_Node._coordinates.columnStart = iVar3;
    (pCVar7->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pCVar7->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Expect(this,0x5d);
    this_00 = pCVar7;
  } while( true );
}

Assistant:

Expr* SQParser::PrefixedExpr()
{
    NestingChecker nc(this);
    //if 'pos' != -1 the previous variable is a local variable
    SQInteger pos;
    Expr *e = Factor(pos);
    bool nextIsNullable = false;
    for(;;) {
        nc.inc();
        switch(_token) {
        case _SC('.'):
        case TK_NULLGETSTR:
        case TK_TYPE_METHOD_GETSTR:
        case TK_NULLABLE_TYPE_METHOD_GETSTR: {
            if (_token == TK_NULLGETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR || nextIsNullable) {
                nextIsNullable = true;
            }

            bool isTypeMethod = _token == TK_TYPE_METHOD_GETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR;

            SQInteger tok = _token;

            Lex();

            if ((_lex._prevflags & (TF_PREP_SPACE | TF_PREP_EOL)) != 0) {
              reportDiagnostic(DiagnosticsId::DI_SPACE_SEP_FIELD_NAME, opname(tok));
            }

            SQInteger l = _lex._currentline, c = _lex._currentcolumn;
            Expr *receiver = e;
            Id *id = (Id *)Expect(TK_IDENTIFIER);
            assert(id);
            e = newNode<GetFieldExpr>(receiver, id->id(), nextIsNullable, isTypeMethod); //-V522
            e->setLineStartPos(receiver->lineStart()); e->setColumnStartPos(receiver->columnStart());
            e->setLineEndPos(l); e->setColumnEndPos(c);
            break;
        }
        case _SC('['):
        case TK_NULLGETOBJ: {
            if (_token == TK_NULLGETOBJ || nextIsNullable)
            {
                nextIsNullable = true;
            }
            if(_lex._prevtoken == _SC('\n'))
                reportDiagnostic(DiagnosticsId::DI_BROKEN_SLOT_DECLARATION);
            if (_token == _SC('['))
              checkSuspiciousBracket();

            Lex();
            Expr *receiver = e;
            Expr *key = Expression(SQE_RVALUE);
            e = setCoordinates(newNode<GetSlotExpr>(receiver, key, nextIsNullable), receiver->lineStart(), receiver->columnStart());
            Expect(_SC(']'));
            break;
        }
        case TK_MINUSMINUS:
        case TK_PLUSPLUS:
            {
                nextIsNullable = false;
                if(IsEndOfStatement()) return e;
                SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                e = setCoordinates(newNode<IncExpr>(e, diff, IF_POSTFIX), e->lineStart(), e->columnStart());
                Lex();
            }
            return e;
        case _SC('('):
        case TK_NULLCALL: {
            if (_lex._prevflags & TF_PREP_EOL && _token == _SC('(')) {
                reportDiagnostic(DiagnosticsId::DI_PAREN_IS_FUNC_CALL);
            }
            SQInteger nullcall = (_token==TK_NULLCALL || nextIsNullable);
            nextIsNullable = !!nullcall;
            SQInteger l = e->lineStart(), c = e->columnStart();
            CallExpr *call = newNode<CallExpr>(arena(), e, nullcall);

            if (_token == _SC('('))
              checkSuspiciousBracket();

            Lex();
            while (_token != _SC(')')) {
                call->addArgument(Expression(SQE_FUNCTION_ARG));
                if (_token == _SC(',')) {
                    Lex();
                }
            }

            setCoordinates(call, l, c);

            Lex();
            e = call;
            break;
        }
        default: return e;
        }
    }
}